

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::EpochUsFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  undefined8 in_RDI;
  _func_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_ClientContext_ptr_FunctionStatisticsInput_ptr
  *tstz_stats;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *tstz_func;
  ScalarFunctionSet *operator_set;
  allocator_type *in_stack_fffffffffffffd58;
  ScalarFunction *function;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffd60;
  ScalarFunction *this;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  LogicalType *local_240;
  LogicalType local_210 [24];
  undefined1 local_1f8 [32];
  LogicalType local_1d8 [32];
  LogicalType *local_1b8;
  LogicalType local_1b0 [24];
  LogicalType *in_stack_fffffffffffffe68;
  undefined1 local_188 [24];
  ScalarFunction local_170;
  ScalarFunction *local_48;
  code *local_40;
  LogicalType local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::LogicalType::LogicalType(local_28,BIGINT);
  GetTimePartFunction<duckdb::DatePart::EpochMicrosecondsOperator,long>(in_stack_fffffffffffffe68);
  duckdb::LogicalType::~LogicalType(local_28);
  local_40 = DatePart::
             UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_48 = (ScalarFunction *)
             DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  local_1b8 = local_1b0;
  duckdb::LogicalType::LogicalType(local_1b8,TIMESTAMP_TZ);
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbef500);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffd70;
  iVar1._M_array = (iterator)in_stack_fffffffffffffd68;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffd74;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd60,iVar1,
             in_stack_fffffffffffffd58);
  duckdb::LogicalType::LogicalType(local_1d8,BIGINT);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(*&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffd60,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)in_stack_fffffffffffffd58);
  function = local_48;
  duckdb::LogicalType::LogicalType(local_210,INVALID);
  this = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_170,local_188,local_1d8,local_1f8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  duckdb::LogicalType::~LogicalType(local_210);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbef60d);
  duckdb::LogicalType::~LogicalType(local_1d8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbef627);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbef634);
  local_240 = (LogicalType *)&stack0xfffffffffffffe68;
  do {
    local_240 = local_240 + -0x18;
    duckdb::LogicalType::~LogicalType(local_240);
  } while (local_240 != local_1b0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet EpochUsFun::GetFunctions() {
	using OP = DatePart::EpochMicrosecondsOperator;
	auto operator_set = GetTimePartFunction<OP>();

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, int64_t, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));
	return operator_set;
}